

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_test.cc
# Opt level: O0

void __thiscall anon_unknown.dwarf_22460c::BNTest_Dec2BN_Test::TestBody(BNTest_Dec2BN_Test *this)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  pointer pbVar4;
  char *in_R9;
  string local_3d0;
  AssertHelper local_3b0;
  Message local_3a8;
  bool local_399;
  undefined1 local_398 [8];
  AssertionResult gtest_ar__9;
  AssertHelper local_368;
  Message local_360;
  int local_354;
  undefined1 local_350 [8];
  AssertionResult gtest_ar__8;
  Message local_338;
  int local_32c;
  undefined1 local_328 [8];
  AssertionResult gtest_ar_4;
  AssertHelper local_2f8;
  Message local_2f0;
  bool local_2e1;
  undefined1 local_2e0 [8];
  AssertionResult gtest_ar__7;
  AssertHelper local_2b0;
  Message local_2a8;
  int local_29c;
  undefined1 local_298 [8];
  AssertionResult gtest_ar__6;
  Message local_280;
  int local_274;
  undefined1 local_270 [8];
  AssertionResult gtest_ar_3;
  AssertHelper local_240;
  Message local_238;
  int local_22c;
  undefined1 local_228 [8];
  AssertionResult gtest_ar__5;
  AssertHelper local_1f8;
  Message local_1f0;
  int local_1e4;
  undefined1 local_1e0 [8];
  AssertionResult gtest_ar__4;
  Message local_1c8;
  int local_1bc;
  undefined1 local_1b8 [8];
  AssertionResult gtest_ar_2;
  AssertHelper local_188;
  Message local_180;
  bool local_171;
  undefined1 local_170 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_140;
  Message local_138;
  int local_12c;
  undefined1 local_128 [8];
  AssertionResult gtest_ar__2;
  Message local_110;
  int local_104;
  undefined1 local_100 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_d0;
  Message local_c8;
  bool local_b9;
  undefined1 local_b8 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_88;
  Message local_80;
  int local_74;
  undefined1 local_70 [8];
  AssertionResult gtest_ar_;
  AssertHelper local_58;
  Message local_50;
  int local_44;
  undefined1 local_40 [8];
  AssertionResult gtest_ar;
  int local_1c;
  int ret;
  UniquePtr<BIGNUM> bn;
  BNTest_Dec2BN_Test *this_local;
  
  bn._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl =
       (__uniq_ptr_data<bignum_st,_bssl::internal::Deleter,_true,_true>)
       (__uniq_ptr_data<bignum_st,_bssl::internal::Deleter,_true,_true>)this;
  std::unique_ptr<bignum_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<bignum_st,bssl::internal::Deleter> *)&stack0xffffffffffffffe8);
  local_1c = DecimalToBIGNUM((UniquePtr<BIGNUM> *)&stack0xffffffffffffffe8,"0");
  local_44 = 1;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_40,"1","ret",&local_44,&local_1c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_40);
  if (!bVar1) {
    testing::Message::Message(&local_50);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_40);
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
               ,0x47b,pcVar3);
    testing::internal::AssertHelper::operator=(&local_58,&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    testing::Message::~Message(&local_50);
  }
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._5_3_ = 0;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_40);
  if (gtest_ar_.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ == 0) {
    pbVar4 = std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                       ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&stack0xffffffffffffffe8);
    local_74 = BN_is_zero(pbVar4);
    testing::AssertionResult::AssertionResult<int>
              ((AssertionResult *)local_70,&local_74,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_70);
    if (!bVar1) {
      testing::Message::Message(&local_80);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__1.message_,(internal *)local_70,
                 (AssertionResult *)"BN_is_zero(bn.get())","false","true",in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_88,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                 ,0x47c,pcVar3);
      testing::internal::AssertHelper::operator=(&local_88,&local_80);
      testing::internal::AssertHelper::~AssertHelper(&local_88);
      std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
      testing::Message::~Message(&local_80);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_70);
    pbVar4 = std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                       ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&stack0xffffffffffffffe8);
    iVar2 = BN_is_negative(pbVar4);
    local_b9 = iVar2 == 0;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_b8,&local_b9,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b8);
    if (!bVar1) {
      testing::Message::Message(&local_c8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar_1.message_,(internal *)local_b8,(AssertionResult *)0x84bce9,
                 "true","false",in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_d0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                 ,0x47d,pcVar3);
      testing::internal::AssertHelper::operator=(&local_d0,&local_c8);
      testing::internal::AssertHelper::~AssertHelper(&local_d0);
      std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
      testing::Message::~Message(&local_c8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_b8);
    local_1c = DecimalToBIGNUM((UniquePtr<BIGNUM> *)&stack0xffffffffffffffe8,"256");
    local_104 = 3;
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((EqHelper *)local_100,"3","ret",&local_104,&local_1c);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_100);
    if (!bVar1) {
      testing::Message::Message(&local_110);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_100);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar__2.message_,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                 ,0x480,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__2.message_,&local_110);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__2.message_);
      testing::Message::~Message(&local_110);
    }
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._5_3_ = 0;
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_100);
    if (gtest_ar_.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ == 0) {
      pbVar4 = std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                         ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&stack0xffffffffffffffe8
                         );
      local_12c = BN_is_word(pbVar4,0x100);
      testing::AssertionResult::AssertionResult<int>
                ((AssertionResult *)local_128,&local_12c,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_128);
      if (!bVar1) {
        testing::Message::Message(&local_138);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar__3.message_,(internal *)local_128,
                   (AssertionResult *)"BN_is_word(bn.get(), 256)","false","true",in_R9);
        pcVar3 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_140,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                   ,0x481,pcVar3);
        testing::internal::AssertHelper::operator=(&local_140,&local_138);
        testing::internal::AssertHelper::~AssertHelper(&local_140);
        std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
        testing::Message::~Message(&local_138);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_128);
      pbVar4 = std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                         ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&stack0xffffffffffffffe8
                         );
      iVar2 = BN_is_negative(pbVar4);
      local_171 = iVar2 == 0;
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_170,&local_171,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_170);
      if (!bVar1) {
        testing::Message::Message(&local_180);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar_2.message_,(internal *)local_170,(AssertionResult *)0x84bce9,
                   "true","false",in_R9);
        pcVar3 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_188,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                   ,0x482,pcVar3);
        testing::internal::AssertHelper::operator=(&local_188,&local_180);
        testing::internal::AssertHelper::~AssertHelper(&local_188);
        std::__cxx11::string::~string((string *)&gtest_ar_2.message_);
        testing::Message::~Message(&local_180);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_170);
      local_1c = DecimalToBIGNUM((UniquePtr<BIGNUM> *)&stack0xffffffffffffffe8,"-42");
      local_1bc = 3;
      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                ((EqHelper *)local_1b8,"3","ret",&local_1bc,&local_1c);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b8);
      if (!bVar1) {
        testing::Message::Message(&local_1c8);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1b8);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar__4.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                   ,0x485,pcVar3);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__4.message_,&local_1c8)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__4.message_);
        testing::Message::~Message(&local_1c8);
      }
      gtest_ar_.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._5_3_ = 0;
      gtest_ar_.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b8);
      if (gtest_ar_.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_4_ == 0) {
        pbVar4 = std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                           ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)
                            &stack0xffffffffffffffe8);
        local_1e4 = BN_abs_is_word(pbVar4,0x2a);
        testing::AssertionResult::AssertionResult<int>
                  ((AssertionResult *)local_1e0,&local_1e4,(type *)0x0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e0);
        if (!bVar1) {
          testing::Message::Message(&local_1f0);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar__5.message_,(internal *)local_1e0,
                     (AssertionResult *)"BN_abs_is_word(bn.get(), 42)","false","true",in_R9);
          pcVar3 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_1f8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                     ,0x486,pcVar3);
          testing::internal::AssertHelper::operator=(&local_1f8,&local_1f0);
          testing::internal::AssertHelper::~AssertHelper(&local_1f8);
          std::__cxx11::string::~string((string *)&gtest_ar__5.message_);
          testing::Message::~Message(&local_1f0);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e0);
        pbVar4 = std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                           ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)
                            &stack0xffffffffffffffe8);
        local_22c = BN_is_negative(pbVar4);
        testing::AssertionResult::AssertionResult<int>
                  ((AssertionResult *)local_228,&local_22c,(type *)0x0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_228);
        if (!bVar1) {
          testing::Message::Message(&local_238);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar_3.message_,(internal *)local_228,
                     (AssertionResult *)0x84bce9,"false","true",in_R9);
          pcVar3 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_240,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                     ,0x487,pcVar3);
          testing::internal::AssertHelper::operator=(&local_240,&local_238);
          testing::internal::AssertHelper::~AssertHelper(&local_240);
          std::__cxx11::string::~string((string *)&gtest_ar_3.message_);
          testing::Message::~Message(&local_238);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_228);
        local_1c = DecimalToBIGNUM((UniquePtr<BIGNUM> *)&stack0xffffffffffffffe8,"-0");
        local_274 = 2;
        testing::internal::EqHelper::Compare<int,_int,_nullptr>
                  ((EqHelper *)local_270,"2","ret",&local_274,&local_1c);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_270);
        if (!bVar1) {
          testing::Message::Message(&local_280);
          pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_270);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar__6.message_,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                     ,0x48a,pcVar3);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar__6.message_,&local_280);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__6.message_);
          testing::Message::~Message(&local_280);
        }
        gtest_ar_.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._5_3_ = 0;
        gtest_ar_.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_1_ = !bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_270);
        if (gtest_ar_.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._4_4_ == 0) {
          pbVar4 = std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                             ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)
                              &stack0xffffffffffffffe8);
          local_29c = BN_is_zero(pbVar4);
          testing::AssertionResult::AssertionResult<int>
                    ((AssertionResult *)local_298,&local_29c,(type *)0x0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_298);
          if (!bVar1) {
            testing::Message::Message(&local_2a8);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar__7.message_,(internal *)local_298,
                       (AssertionResult *)"BN_is_zero(bn.get())","false","true",in_R9);
            pcVar3 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_2b0,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                       ,0x48b,pcVar3);
            testing::internal::AssertHelper::operator=(&local_2b0,&local_2a8);
            testing::internal::AssertHelper::~AssertHelper(&local_2b0);
            std::__cxx11::string::~string((string *)&gtest_ar__7.message_);
            testing::Message::~Message(&local_2a8);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_298);
          pbVar4 = std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                             ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)
                              &stack0xffffffffffffffe8);
          iVar2 = BN_is_negative(pbVar4);
          local_2e1 = iVar2 == 0;
          testing::AssertionResult::AssertionResult<bool>
                    ((AssertionResult *)local_2e0,&local_2e1,(type *)0x0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2e0);
          if (!bVar1) {
            testing::Message::Message(&local_2f0);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar_4.message_,(internal *)local_2e0,
                       (AssertionResult *)0x84bce9,"true","false",in_R9);
            pcVar3 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_2f8,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                       ,0x48c,pcVar3);
            testing::internal::AssertHelper::operator=(&local_2f8,&local_2f0);
            testing::internal::AssertHelper::~AssertHelper(&local_2f8);
            std::__cxx11::string::~string((string *)&gtest_ar_4.message_);
            testing::Message::~Message(&local_2f0);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_2e0);
          local_1c = DecimalToBIGNUM((UniquePtr<BIGNUM> *)&stack0xffffffffffffffe8,
                                     "42trailing garbage is ignored");
          local_32c = 2;
          testing::internal::EqHelper::Compare<int,_int,_nullptr>
                    ((EqHelper *)local_328,"2","ret",&local_32c,&local_1c);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_328);
          if (!bVar1) {
            testing::Message::Message(&local_338);
            pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_328);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar__8.message_,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                       ,0x48f,pcVar3);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar__8.message_,&local_338);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__8.message_);
            testing::Message::~Message(&local_338);
          }
          gtest_ar_.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._5_3_ = 0;
          gtest_ar_.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_1_ = !bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_328);
          if (gtest_ar_.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._4_4_ == 0) {
            pbVar4 = std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                               ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)
                                &stack0xffffffffffffffe8);
            local_354 = BN_abs_is_word(pbVar4,0x2a);
            testing::AssertionResult::AssertionResult<int>
                      ((AssertionResult *)local_350,&local_354,(type *)0x0);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_350);
            if (!bVar1) {
              testing::Message::Message(&local_360);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&gtest_ar__9.message_,(internal *)local_350,
                         (AssertionResult *)"BN_abs_is_word(bn.get(), 42)","false","true",in_R9);
              pcVar3 = (char *)std::__cxx11::string::c_str();
              testing::internal::AssertHelper::AssertHelper
                        (&local_368,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                         ,0x490,pcVar3);
              testing::internal::AssertHelper::operator=(&local_368,&local_360);
              testing::internal::AssertHelper::~AssertHelper(&local_368);
              std::__cxx11::string::~string((string *)&gtest_ar__9.message_);
              testing::Message::~Message(&local_360);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_350);
            pbVar4 = std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                               ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)
                                &stack0xffffffffffffffe8);
            iVar2 = BN_is_negative(pbVar4);
            local_399 = iVar2 == 0;
            testing::AssertionResult::AssertionResult<bool>
                      ((AssertionResult *)local_398,&local_399,(type *)0x0);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_398);
            if (!bVar1) {
              testing::Message::Message(&local_3a8);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        (&local_3d0,(internal *)local_398,(AssertionResult *)0x84bce9,"true","false"
                         ,in_R9);
              pcVar3 = (char *)std::__cxx11::string::c_str();
              testing::internal::AssertHelper::AssertHelper
                        (&local_3b0,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                         ,0x491,pcVar3);
              testing::internal::AssertHelper::operator=(&local_3b0,&local_3a8);
              testing::internal::AssertHelper::~AssertHelper(&local_3b0);
              std::__cxx11::string::~string((string *)&local_3d0);
              testing::Message::~Message(&local_3a8);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_398);
            gtest_ar_.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._4_4_ = 0;
          }
        }
      }
    }
  }
  std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&stack0xffffffffffffffe8);
  return;
}

Assistant:

TEST_F(BNTest, Dec2BN) {
  bssl::UniquePtr<BIGNUM> bn;
  int ret = DecimalToBIGNUM(&bn, "0");
  ASSERT_EQ(1, ret);
  EXPECT_TRUE(BN_is_zero(bn.get()));
  EXPECT_FALSE(BN_is_negative(bn.get()));

  ret = DecimalToBIGNUM(&bn, "256");
  ASSERT_EQ(3, ret);
  EXPECT_TRUE(BN_is_word(bn.get(), 256));
  EXPECT_FALSE(BN_is_negative(bn.get()));

  ret = DecimalToBIGNUM(&bn, "-42");
  ASSERT_EQ(3, ret);
  EXPECT_TRUE(BN_abs_is_word(bn.get(), 42));
  EXPECT_TRUE(BN_is_negative(bn.get()));

  ret = DecimalToBIGNUM(&bn, "-0");
  ASSERT_EQ(2, ret);
  EXPECT_TRUE(BN_is_zero(bn.get()));
  EXPECT_FALSE(BN_is_negative(bn.get()));

  ret = DecimalToBIGNUM(&bn, "42trailing garbage is ignored");
  ASSERT_EQ(2, ret);
  EXPECT_TRUE(BN_abs_is_word(bn.get(), 42));
  EXPECT_FALSE(BN_is_negative(bn.get()));
}